

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

void EncodeSetOrSequenceOf<Extension>
               (DerType type,vector<Extension,_std::allocator<Extension>_> *in,uchar *pOut,
               size_t cbOut,size_t *cbUsed)

{
  bool bVar1;
  size_t sVar2;
  pointer pEVar3;
  out_of_range *this;
  code *pcVar4;
  size_t sVar5;
  undefined *puVar6;
  ulong uVar7;
  ulong uVar8;
  size_t local_38;
  size_t cbInternal;
  
  local_38 = 0;
  if ((in->super__Vector_base<Extension,_std::allocator<Extension>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (in->super__Vector_base<Extension,_std::allocator<Extension>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    if (cbOut < 2) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error
                ((overflow_error *)this,"Overflow in EncodeSetOrSequenceOf");
      puVar6 = &std::overflow_error::typeinfo;
      pcVar4 = std::overflow_error::~overflow_error;
      goto LAB_00115320;
    }
    pOut[0] = '\x05';
    pOut[1] = '\0';
    sVar5 = 2;
  }
  else {
    *pOut = (uchar)type;
    sVar2 = GetDataSize<Extension>(in);
    sVar5 = 2;
    if (sVar2 != 0) {
      sVar5 = sVar2;
    }
    bVar1 = EncodeSize(sVar5,pOut + 1,cbOut - 1,&local_38);
    if (!bVar1) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this,"Error in EncodeSize");
      puVar6 = &std::out_of_range::typeinfo;
      pcVar4 = std::out_of_range::~out_of_range;
LAB_00115320:
      __cxa_throw(this,puVar6,pcVar4);
    }
    sVar5 = local_38 + 1;
    pEVar3 = (in->super__Vector_base<Extension,_std::allocator<Extension>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((in->super__Vector_base<Extension,_std::allocator<Extension>_>)._M_impl.
        super__Vector_impl_data._M_finish != pEVar3) {
      uVar7 = 0;
      uVar8 = 1;
      do {
        Extension::Encode(pEVar3 + uVar7,pOut + sVar5,cbOut - sVar5,&local_38);
        sVar5 = sVar5 + local_38;
        pEVar3 = (in->super__Vector_base<Extension,_std::allocator<Extension>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        bVar1 = uVar8 < (ulong)((long)(in->super__Vector_base<Extension,_std::allocator<Extension>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3 >>
                               7);
        uVar7 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar1);
    }
  }
  *cbUsed = sVar5;
  return;
}

Assistant:

void EncodeSetOrSequenceOf(DerType type, std::vector<T>& in, unsigned char * pOut, size_t cbOut, size_t & cbUsed)
{
	size_t cbInternal = 0;
	size_t offset = 0;

	if (in.size() == 0)
	{
		if (cbOut < 2)
			throw std::overflow_error("Overflow in EncodeSetOrSequenceOf");

		pOut[0] = static_cast<unsigned char>(DerType::Null);
		pOut[1] = 0;
		cbUsed = 2;
		return;
	}

	pOut[0] = static_cast<unsigned char>(type);

	size_t cbVector = GetEncodedSize(in);

	offset = 1;
	if (!EncodeSize(cbVector, pOut + offset, cbOut - offset, cbInternal))
		throw std::out_of_range("Error in EncodeSize");

	offset += cbInternal;

	for (unsigned int i = 0; i < in.size(); ++i)
	{
		in[i].Encode(pOut + offset, cbOut - offset, cbInternal);
		offset += cbInternal;
	}

	cbUsed = offset;
}